

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::BindStaticResources
          (PipelineStateBase<Diligent::EngineGLImplTraits> *this,SHADER_TYPE ShaderStages,
          IResourceMapping *pResourceMapping,BIND_SHADER_RESOURCES_FLAGS Flags)

{
  undefined *puVar1;
  undefined8 uVar2;
  PipelineResourceSignatureImplType *this_00;
  undefined1 local_48 [8];
  string _msg;
  BIND_SHADER_RESOURCES_FLAGS Flags_local;
  IResourceMapping *pResourceMapping_local;
  SHADER_TYPE ShaderStages_local;
  PipelineStateBase<Diligent::EngineGLImplTraits> *this_local;
  
  _msg.field_2._12_4_ = Flags;
  CheckPipelineReady(this);
  if ((this->m_UsingImplicitSignature & 1U) == 0) {
    FormatString<char[165]>
              ((string *)local_48,
               (char (*) [165])
               "IPipelineState::BindStaticResources is not allowed for pipelines that use explicit resource signatures. Use IPipelineResourceSignature::BindStaticResources instead."
              );
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar2 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(2,uVar2,0);
    }
    std::__cxx11::string::~string((string *)local_48);
  }
  else {
    this_00 = GetResourceSignature(this,0);
    PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::BindStaticResources
              (&this_00->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,
               ShaderStages,pResourceMapping,_msg.field_2._12_4_);
  }
  return;
}

Assistant:

BindStaticResources(SHADER_TYPE                 ShaderStages,
                                                        IResourceMapping*           pResourceMapping,
                                                        BIND_SHADER_RESOURCES_FLAGS Flags) override final
    {
        CheckPipelineReady();

        if (!m_UsingImplicitSignature)
        {
            LOG_ERROR_MESSAGE("IPipelineState::BindStaticResources is not allowed for pipelines that use explicit "
                              "resource signatures. Use IPipelineResourceSignature::BindStaticResources instead.");
            return;
        }

        return this->GetResourceSignature(0)->BindStaticResources(ShaderStages, pResourceMapping, Flags);
    }